

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::DelayedObjects<int>::fulfillAllPromises(DelayedObjects<int> *this,int *val)

{
  mapped_type *this_00;
  _Base_ptr p_Var1;
  mapped_type *this_01;
  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  *__range3;
  
  std::mutex::lock(&this->promiseLock);
  for (p_Var1 = (this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::promise<int>::set_value((promise<int> *)&p_Var1[1]._M_parent,val);
    this_00 = std::
              map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
              ::operator[](&this->usedPromiseByInteger,(key_type *)(p_Var1 + 1));
    std::promise<int>::operator=(this_00,(promise<int> *)&p_Var1[1]._M_parent);
  }
  for (p_Var1 = (this->promiseByString)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->promiseByString)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::promise<int>::set_value((promise<int> *)(p_Var1 + 2),val);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
              ::operator[](&this->usedPromiseByString,(key_type *)(p_Var1 + 1));
    std::promise<int>::operator=(this_01,(promise<int> *)(p_Var1 + 2));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
           *)this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
  ::clear(&(this->promiseByString)._M_t);
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return;
}

Assistant:

void fulfillAllPromises(const X& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        for (auto& pr : promiseByInteger) {
            pr.second.set_value(val);
            usedPromiseByInteger[pr.first] = std::move(pr.second);
        }
        for (auto& pr : promiseByString) {
            pr.second.set_value(val);
            usedPromiseByString[pr.first] = std::move(pr.second);
        }
        promiseByInteger.clear();
        promiseByString.clear();
    }